

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value.h
# Opt level: O0

void __thiscall
xemmai::t_value<xemmai::t_pointer>::f_put
          (t_value<xemmai::t_pointer> *this,t_object *a_key,size_t *a_index,
          t_value<xemmai::t_pointer> *a_value)

{
  t_object *this_00;
  t_type *this_01;
  t_object *p;
  t_value<xemmai::t_pointer> *a_value_local;
  size_t *a_index_local;
  t_object *a_key_local;
  t_value<xemmai::t_pointer> *this_local;
  
  this_00 = f_object_or_throw(this);
  this_01 = t_object::f_type(this_00);
  t_type_of<xemmai::t_object>::f_put(this_01,this_00,a_key,a_index,a_value);
  return;
}

Assistant:

void f_put(t_object* a_key, size_t& a_index, const t_value<t_pointer>& a_value) const
	{
		auto p = f_object_or_throw();
		p->f_type()->f_put(p, a_key, a_index, a_value);
	}